

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedPathAlikeUtilities.h
# Opt level: O0

size_t OpenSteer::previousSegment<OpenSteer::PolylineSegmentedPathwaySegmentRadii>
                 (PolylineSegmentedPathwaySegmentRadii *pathAlike,size_t segmentIndex)

{
  ulong uVar1;
  long lVar2;
  long in_RSI;
  long *in_RDI;
  undefined8 local_10;
  
  if (in_RSI == 0) {
    uVar1 = (**(code **)(*in_RDI + 0x30))();
    if ((uVar1 & 1) == 0) {
      local_10 = 0;
    }
    else {
      lVar2 = (**(code **)(*in_RDI + 0x50))();
      local_10 = lVar2 - 1;
    }
  }
  else {
    local_10 = in_RSI - 1;
  }
  return local_10;
}

Assistant:

size_t previousSegment( SegmentedPathAlike const& pathAlike, size_t segmentIndex ) {
        assert( pathAlike.isValid() && "pathAlike isn't valid." );
        assert( segmentIndex < pathAlike.segmentCount() && "segmentIndex out of range." );
        

        if ( 0 != segmentIndex ) {
            --segmentIndex;

        } else if ( pathAlike.isCyclic() ) {
            segmentIndex = pathAlike.segmentCount() - 1;
        }
        
        return segmentIndex;
    }